

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  ImSpan<ImGuiTableColumn> *this;
  ImSpan<signed_char> *this_00;
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  char cVar9;
  ImGuiWindow *pIVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  ImU32 id;
  ulong uVar15;
  ImGuiTableColumn *pIVar16;
  char *pcVar17;
  ImGuiTableColumn *pIVar18;
  byte *pbVar19;
  uint uVar20;
  int iVar21;
  int order_n;
  int order_n_1;
  byte bVar22;
  int column_n;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float local_d0;
  float local_c8;
  int local_98;
  ImGuiContext *g;
  ImRect host_clip_rect;
  ImRect local_40;
  
  pIVar11 = GImGui;
  if (table->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x2342,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  fVar30 = (table->WorkRect).Min.x;
  fVar1 = (table->WorkRect).Min.y;
  fVar29 = (table->WorkRect).Max.x;
  fVar2 = (pIVar11->Style).FramePadding.x;
  fVar26 = table->CellPaddingX + table->CellPaddingX + fVar2 + table->CellSpacingX1 +
           table->CellSpacingX2;
  table->LeftMostStretchedColumnDisplayOrder = -1;
  this = &table->Columns;
  fVar27 = 0.0;
  fVar34 = 0.0;
  local_d0 = 0.0;
  iVar21 = 0;
  for (uVar24 = 0; uVar15 = (ulong)table->ColumnsCount, (long)uVar24 < (long)uVar15;
      uVar24 = uVar24 + 1) {
    if ((table->VisibleMaskByIndex >> (uVar24 & 0x3f) & 1) != 0) {
      pIVar16 = ImSpan<ImGuiTableColumn>::operator[](this,(int)uVar24);
      uVar14 = TableFixColumnFlags(table,pIVar16->FlagsIn);
      uVar20 = (uint)(uVar24 != 0) * 0x8000 + 0x8000;
      if ((uVar14 & 0x18000) != 0) {
        uVar20 = 0;
      }
      uVar20 = uVar20 | uVar14;
      pIVar16->Flags = uVar20;
      uVar14 = table->Flags;
      if ((uVar14 & 8) != 0) {
        TableFixColumnSortDirection(pIVar16);
        uVar14 = table->Flags;
        uVar20 = pIVar16->Flags;
      }
      uVar25 = -(uint)(pIVar16->ContentMaxXUnfrozen <= pIVar16->ContentMaxXFrozen);
      fVar28 = (float)(~uVar25 & (uint)pIVar16->ContentMaxXUnfrozen |
                      (uint)pIVar16->ContentMaxXFrozen & uVar25) - pIVar16->WorkMinX;
      if ((uVar20 & 0x1000) == 0 && (uVar14 & 0x20000) == 0) {
        fVar31 = pIVar16->ContentMaxXHeadersIdeal - pIVar16->WorkMinX;
        uVar25 = -(uint)(fVar31 <= fVar28);
        fVar28 = (float)((uint)fVar28 & uVar25 | ~uVar25 & (uint)fVar31);
      }
      fVar28 = (float)(~-(uint)(fVar2 <= fVar28) & (uint)fVar2 |
                      (uint)fVar28 & -(uint)(fVar2 <= fVar28));
      if ((((uVar20 & 8) != 0) && (fVar31 = pIVar16->InitStretchWeightOrWidth, 0.0 < fVar31)) &&
         (((uVar14 & 1) == 0 || ((uVar20 & 0x20) == 0)))) {
        fVar28 = (float)(~-(uint)(fVar31 <= fVar28) & (uint)fVar31 |
                        -(uint)(fVar31 <= fVar28) & (uint)fVar28);
      }
      pIVar16->WidthAuto = fVar28;
      if ((uVar20 & 0x18) == 0) {
        if ((uVar20 & 4) == 0) {
          __assert_fail("column->Flags & ImGuiTableColumnFlags_WidthStretch",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                        ,0x2387,"void ImGui::TableUpdateLayout(ImGuiTable *)");
        }
        if (pIVar16->AutoFitQueue == '\0') {
          fVar31 = pIVar16->StretchWeight;
        }
        else {
          uVar20 = -(uint)(0.0 < pIVar16->InitStretchWeightOrWidth);
          fVar31 = (float)(~uVar20 & 0x3f800000 | (uint)pIVar16->InitStretchWeightOrWidth & uVar20);
          pIVar16->StretchWeight = fVar31;
        }
        local_d0 = local_d0 + fVar31;
        if ((table->LeftMostStretchedColumnDisplayOrder == -1) ||
           (pIVar16->DisplayOrder < table->LeftMostStretchedColumnDisplayOrder)) {
          table->LeftMostStretchedColumnDisplayOrder = pIVar16->DisplayOrder;
        }
      }
      else {
        if (pIVar16->AutoFitQueue == '\0') {
          if (((uVar20 & 0x10) != 0) && (pIVar16->IsClipped == false)) {
            pIVar16->WidthRequest = fVar28;
          }
        }
        else {
          pIVar16->WidthRequest = fVar28;
          if ((pIVar16->AutoFitQueue != '\x01') && (table->IsInitializing == true)) {
            uVar20 = -(uint)(fVar2 * 4.0 <= fVar28);
            pIVar16->WidthRequest = (float)(~uVar20 & (uint)(fVar2 * 4.0) | uVar20 & (uint)fVar28);
          }
        }
        iVar21 = iVar21 + 1;
        fVar34 = fVar34 + pIVar16->WidthRequest;
      }
      fVar27 = (float)((uint)fVar27 & -(uint)(fVar28 <= fVar27) |
                      ~-(uint)(fVar28 <= fVar27) & (uint)fVar28);
      fVar34 = fVar34 + table->CellPaddingX + table->CellPaddingX;
    }
  }
  table->ColumnsVisibleFixedCount = (ImS8)iVar21;
  uVar20 = table->Flags;
  uVar14 = uVar20;
  if ((uVar20 >> 0x10 & 1) != 0) {
    for (uVar24 = 0; (long)uVar24 < (long)(int)uVar15; uVar24 = uVar24 + 1) {
      if ((table->VisibleMaskByIndex >> (uVar24 & 0x3f) & 1) != 0) {
        pIVar16 = ImSpan<ImGuiTableColumn>::operator[](this,(int)uVar24);
        if ((pIVar16->Flags & 0x18) == 0) {
          local_d0 = local_d0 + (1.0 - pIVar16->StretchWeight);
          pIVar16->StretchWeight = 1.0;
          if (iVar21 < 1) goto LAB_002d4d88;
        }
        else {
          fVar34 = fVar34 + (fVar27 - pIVar16->WidthRequest);
        }
        pIVar16->WidthRequest = fVar27;
      }
LAB_002d4d88:
      uVar15 = (ulong)(uint)table->ColumnsCount;
    }
    uVar14 = table->Flags;
  }
  bVar22 = (byte)(uVar20 >> 0x10) & 0 < iVar21;
  fVar27 = table->OuterPaddingX + table->OuterPaddingX +
           (float)(table->ColumnsVisibleCount + -1) * (table->CellSpacingX1 + table->CellSpacingX2);
  if ((((uVar14 >> 0x19 & 1) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth))) {
    fVar29 = fVar29 - fVar30;
  }
  else {
    fVar29 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  fVar34 = (fVar29 - fVar27) - fVar34;
  local_c8 = 0.0;
  if (bVar22 == 0) {
    local_c8 = fVar34;
  }
  table->ColumnsTotalWidth = fVar27;
  table->ColumnsAutoFitWidth = fVar27;
  this_00 = &table->DisplayOrderToIndex;
  iVar21 = 0;
  for (uVar24 = 0; (long)uVar24 < (long)(int)uVar15; uVar24 = uVar24 + 1) {
    if ((table->VisibleMaskByDisplayOrder >> (uVar24 & 0x3f) & 1) != 0) {
      pcVar17 = ImSpan<signed_char>::operator[](this_00,(int)uVar24);
      pIVar16 = ImSpan<ImGuiTableColumn>::operator[](this,(int)*pcVar17);
      if ((pIVar16->Flags & 4) != 0) {
        if (bVar22 == 0) {
          fVar29 = (pIVar16->StretchWeight / local_d0) * fVar34;
          uVar20 = -(uint)(fVar2 <= fVar29);
          fVar29 = (float)(int)((float)(~uVar20 & (uint)fVar2 | (uint)fVar29 & uVar20) + 0.01);
          pIVar16->WidthRequest = fVar29;
          local_c8 = local_c8 - fVar29;
        }
        if (pIVar16->NextVisibleColumn != -1) {
          pIVar18 = ImSpan<ImGuiTableColumn>::operator[](this,(int)pIVar16->NextVisibleColumn);
          if ((pIVar18->Flags & 8U) != 0) {
            pIVar16->Flags = pIVar16->Flags | pIVar18->Flags & 0x40000000U;
          }
        }
      }
      if (pIVar16->NextVisibleColumn == -1) {
        uVar20 = pIVar16->Flags;
        if (table->LeftMostStretchedColumnDisplayOrder != -1) {
          uVar20 = uVar20 | 0x40000000;
          pIVar16->Flags = uVar20;
        }
      }
      else {
        uVar20 = pIVar16->Flags;
      }
      iVar21 = iVar21 + (uint)((uVar20 & 0x20) == 0);
      uVar20 = -(uint)(fVar2 <= pIVar16->WidthRequest);
      fVar27 = (float)(int)(float)(~uVar20 & (uint)fVar2 | (uint)pIVar16->WidthRequest & uVar20);
      pIVar16->WidthGiven = fVar27;
      fVar29 = pIVar16->WidthAuto;
      fVar28 = table->CellPaddingX + table->CellPaddingX;
      uVar3 = table->ColumnsTotalWidth;
      uVar6 = table->ColumnsAutoFitWidth;
      table->ColumnsTotalWidth = (float)uVar3 + fVar28 + fVar27;
      table->ColumnsAutoFitWidth = (float)uVar6 + fVar28 + fVar29;
      uVar15 = (ulong)(uint)table->ColumnsCount;
    }
  }
  if (((1.0 <= local_c8) && ((table->Flags & 0x100000) == 0)) && (0.0 < local_d0)) {
    uVar15 = uVar15 & 0xffffffff;
    do {
      uVar24 = uVar15 & 0xffffffff;
      do {
        do {
          uVar15 = uVar15 - 1;
          if ((local_c8 < 1.0) || ((int)uVar24 < 1)) goto LAB_002d4f9b;
          uVar20 = (int)uVar24 - 1;
          uVar24 = (ulong)uVar20;
        } while ((table->VisibleMaskByDisplayOrder >> (uVar15 & 0x3f) & 1) == 0);
        pcVar17 = ImSpan<signed_char>::operator[](this_00,uVar20);
        pIVar16 = ImSpan<ImGuiTableColumn>::operator[](this,(int)*pcVar17);
      } while ((pIVar16->Flags & 4) == 0);
      uVar5 = pIVar16->WidthRequest;
      uVar8 = pIVar16->WidthGiven;
      pIVar16->WidthRequest = (float)uVar5 + 1.0;
      pIVar16->WidthGiven = (float)uVar8 + 1.0;
      local_c8 = local_c8 + -1.0;
    } while( true );
  }
LAB_002d4f9b:
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar29 = (table->OuterRect).Max.y;
  local_40.Min.x = (table->OuterRect).Min.x;
  local_40.Min.y = (table->OuterRect).Min.y;
  fVar34 = local_40.Min.y + table->LastOuterHeight;
  uVar20 = -(uint)(fVar34 <= fVar29);
  local_40.Max.y = (float)(uVar20 & (uint)fVar29 | ~uVar20 & (uint)fVar34);
  iVar23 = 0;
  bVar12 = ItemHoverable(&local_40,0);
  fVar29 = fVar30;
  if ('\0' < table->FreezeColumnsCount) {
    fVar29 = (table->OuterRect).Min.x;
  }
  fVar29 = (fVar29 + table->OuterPaddingX) - table->CellSpacingX1;
  host_clip_rect.Min = (table->InnerClipRect).Min;
  host_clip_rect.Max = (table->InnerClipRect).Max;
  uVar24 = 0;
  local_98 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar24) {
      if ((bVar12) && (table->HoveredColumnBody == -1)) {
        fVar30 = (table->WorkRect).Min.x;
        if (table->RightMostVisibleColumn != -1) {
          pIVar16 = ImSpan<ImGuiTableColumn>::operator[](this,(int)table->RightMostVisibleColumn);
          fVar1 = (pIVar16->ClipRect).Max.x;
          uVar20 = -(uint)(fVar1 <= fVar30);
          fVar30 = (float)(uVar20 & (uint)fVar30 | ~uVar20 & (uint)fVar1);
        }
        if (fVar30 <= (pIVar11->IO).MousePos.x) {
          table->HoveredColumnBody = (ImS8)table->ColumnsCount;
        }
      }
      if ((iVar21 == 0) && ((table->Flags & 1U) != 0)) {
        table->Flags = table->Flags & 0xfffffffe;
      }
      TableUpdateDrawChannels(table);
      if ((table->Flags & 1) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if ((table->IsContextPopupOpen == true) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        bVar12 = BeginPopupEx(id,0x141);
        if (bVar12) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      pIVar10 = table->InnerWindow;
      if ((table->Flags & 0x200000) == 0) {
        ImDrawList::PushClipRect
                  (pIVar10->DrawList,(pIVar10->ClipRect).Min,(pIVar10->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar10->DrawList,2);
      }
      if ((table->IsSortSpecsDirty == true) && ((table->Flags & 8) != 0)) {
        TableSortSpecsBuild(table);
      }
      return;
    }
    pbVar19 = (byte *)ImSpan<signed_char>::operator[](this_00,(int)uVar24);
    bVar22 = *pbVar19;
    pIVar16 = ImSpan<ImGuiTableColumn>::operator[](this,(int)(char)bVar22);
    cVar9 = table->FreezeColumnsCount;
    pIVar16->NavLayerCurrent = '\0' < table->FreezeRowsCount || (char)bVar22 < cVar9;
    if (local_98 == cVar9 && '\0' < cVar9) {
      fVar29 = fVar29 + (fVar30 - (table->OuterRect).Min.x);
    }
    if ((table->VisibleMaskByDisplayOrder >> (uVar24 & 0x3f) & 1) == 0) {
      (pIVar16->ClipRect).Max.x = fVar29;
      (pIVar16->ClipRect).Min.x = fVar29;
      pIVar16->WorkMinX = fVar29;
      pIVar16->MaxX = fVar29;
      pIVar16->MinX = fVar29;
      pIVar16->WidthGiven = 0.0;
      (pIVar16->ClipRect).Min.y = fVar1;
      (pIVar16->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar16->ClipRect,&host_clip_rect);
      pIVar16->IsClipped = true;
      pIVar16->IsSkipItems = true;
      pIVar16->ItemWidth = 1.0;
    }
    else {
      if (((uint)table->Flags >> 0x19 & 1) == 0) {
        fVar34 = table->CellPaddingX;
        fVar27 = table->CellSpacingX2;
        if (((uint)table->Flags >> 0x13 & 1) == 0) {
          fVar28 = (((((table->WorkRect).Max.x -
                      (float)(~(int)pIVar16->IndexWithinVisibleSet + (int)table->ColumnsVisibleCount
                             ) * fVar26) - fVar29) - fVar27) - (fVar34 + fVar34)) -
                   table->OuterPaddingX;
        }
        else {
LAB_002d51fb:
          fVar28 = 3.4028235e+38;
        }
      }
      else {
        fVar34 = table->CellPaddingX;
        fVar27 = table->CellSpacingX2;
        if ((long)table->FreezeColumnsRequest <= (long)uVar24) goto LAB_002d51fb;
        fVar28 = (((((table->InnerClipRect).Max.x -
                    (float)(table->FreezeColumnsRequest + iVar23) * fVar26) - fVar29) -
                  table->OuterPaddingX) - fVar34) - fVar27;
      }
      uVar4 = pIVar16->WidthRequest;
      uVar7 = pIVar16->WidthGiven;
      auVar32._4_4_ = uVar7;
      auVar32._0_4_ = uVar4;
      auVar32._8_8_ = 0;
      auVar33._4_4_ = fVar28;
      auVar33._0_4_ = fVar2;
      auVar33._8_8_ = 0;
      auVar33 = minps(auVar32,auVar33);
      uVar20 = -(uint)(auVar33._0_4_ <= auVar33._4_4_);
      fVar31 = (float)(~uVar20 & (uint)auVar33._0_4_ | (uint)auVar33._4_4_ & uVar20);
      pIVar16->WidthGiven = fVar31;
      pIVar16->MinX = fVar29;
      fVar28 = table->CellSpacingX1;
      fVar35 = fVar34 + fVar34 + fVar31 + fVar29 + fVar28 + fVar27;
      pIVar16->MaxX = fVar35;
      pIVar16->WorkMinX = fVar29 + fVar34 + fVar28;
      pIVar16->WorkMaxX = (fVar35 - fVar34) - fVar27;
      pIVar16->ItemWidth = (float)(int)(fVar31 * 0.65);
      (pIVar16->ClipRect).Min.x = fVar29;
      (pIVar16->ClipRect).Min.y = fVar1;
      (pIVar16->ClipRect).Max.x = fVar35;
      (pIVar16->ClipRect).Max.y = 3.4028235e+38;
      ImRect::ClipWithFull(&pIVar16->ClipRect,&host_clip_rect);
      fVar34 = (pIVar16->ClipRect).Min.x;
      if ((fVar34 < (pIVar16->ClipRect).Max.x) || ((pIVar16->AutoFitQueue & 1) != 0)) {
        pIVar16->IsClipped = false;
      }
      else {
        pIVar16->IsClipped = (bool)(~pIVar16->CannotSkipItemsQueue & 1);
        if ((pIVar16->CannotSkipItemsQueue & 1) == 0) {
          table->VisibleUnclippedMaskByIndex =
               table->VisibleUnclippedMaskByIndex &
               (-2L << (bVar22 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar22 & 0x3f));
        }
      }
      bVar13 = true;
      if (pIVar16->IsVisible == true) {
        bVar13 = table->HostSkipItems;
      }
      pIVar16->IsSkipItems = bVar13;
      if (((bVar12) && (fVar27 = (pIVar11->IO).MousePos.x, fVar34 <= fVar27)) &&
         (fVar27 < (pIVar16->ClipRect).Max.x)) {
        table->HoveredColumnBody = bVar22;
      }
      fVar34 = pIVar16->WorkMinX;
      pIVar16->ContentMaxXFrozen = fVar34;
      pIVar16->ContentMaxXUnfrozen = fVar34;
      pIVar16->ContentMaxXHeadersUsed = fVar34;
      pIVar16->ContentMaxXHeadersIdeal = fVar34;
      if (table->HostSkipItems == false) {
        pIVar16->AutoFitQueue = pIVar16->AutoFitQueue >> 1;
        pIVar16->CannotSkipItemsQueue = pIVar16->CannotSkipItemsQueue >> 1;
      }
      if (local_98 < table->FreezeColumnsCount) {
        fVar34 = pIVar16->MaxX + 1.0;
        uVar20 = -(uint)(fVar34 <= host_clip_rect.Min.x);
        host_clip_rect.Min.x = (float)(~uVar20 & (uint)fVar34 | (uint)host_clip_rect.Min.x & uVar20)
        ;
      }
      fVar29 = fVar29 + table->CellPaddingX + table->CellPaddingX +
                        pIVar16->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2;
      local_98 = local_98 + 1;
    }
    uVar24 = uVar24 + 1;
    iVar23 = iVar23 + -1;
  } while( true );
}

Assistant:

void    ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;

    // Compute offset, clip rect for the frame
    // (can't make auto padding larger than what WorkRect knows about so right-alignment matches)
    const ImRect work_rect = table->WorkRect;
    const float min_column_width = TableGetMinColumnWidth();
    const float min_column_distance = min_column_width + table->CellPaddingX * 2.0f + table->CellSpacingX1 + table->CellSpacingX2;

    int count_fixed = 0;
    float sum_weights_stretched = 0.0f;     // Sum of all weights for weighted columns.
    float sum_width_fixed_requests = 0.0f;  // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns.
    float max_width_auto = 0.0f;
    table->LeftMostStretchedColumnDisplayOrder = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->VisibleMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Adjust flags: default width mode + weighted columns are not allowed when auto extending
        // FIXME-TABLE: Clarify why we need to do this again here and not just in TableSetupColumn()
        column->Flags = TableFixColumnFlags(table, column->FlagsIn);
        if ((column->Flags & ImGuiTableColumnFlags_IndentMask_) == 0)
            column->Flags |= (column_n == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

        // We have a unusual edge case where if the user doesn't call TableGetSortSpecs() but has sorting enabled
        // or varying sorting flags, we still want the sorting arrows to honor those flags.
        if (table->Flags & ImGuiTableFlags_Sortable)
            TableFixColumnSortDirection(column);

        // Calculate "ideal" column width for nothing to be clipped.
        // Combine width from regular rows + width from headers unless requested not to.
        const float content_width_body = (float)ImMax(column->ContentMaxXFrozen, column->ContentMaxXUnfrozen) - column->WorkMinX;
        const float content_width_headers = (float)column->ContentMaxXHeadersIdeal - column->WorkMinX;
        float width_auto = content_width_body;
        if (!(table->Flags & ImGuiTableFlags_NoHeadersWidth) && !(column->Flags & ImGuiTableColumnFlags_NoHeaderWidth))
            width_auto = ImMax(width_auto, content_width_headers);
        width_auto = ImMax(width_auto, min_column_width);

        // Non-resizable columns also submit their requested width
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f)
            if (!(table->Flags & ImGuiTableFlags_Resizable) || !(column->Flags & ImGuiTableColumnFlags_NoResize))
                width_auto = ImMax(width_auto, column->InitStretchWeightOrWidth);

        column->WidthAuto = width_auto;

        if (column->Flags & (ImGuiTableColumnFlags_WidthFixed | ImGuiTableColumnFlags_WidthAutoResize))
        {
            // Process auto-fit for non-stretched columns
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if ((column->AutoFitQueue != 0x00) || ((column->Flags & ImGuiTableColumnFlags_WidthAutoResize) && !column->IsClipped))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            if (column->AutoFitQueue > 0x01 && table->IsInitializing)
                column->WidthRequest = ImMax(column->WidthRequest, min_column_width * 4.0f); // FIXME-TABLE: Another constant/scale?

            count_fixed += 1;
            sum_width_fixed_requests += column->WidthRequest;
        }
        else
        {
            IM_ASSERT(column->Flags & ImGuiTableColumnFlags_WidthStretch);
            const float default_weight = (column->InitStretchWeightOrWidth > 0.0f) ? column->InitStretchWeightOrWidth : 1.0f;
            if (column->AutoFitQueue != 0x00)
                column->StretchWeight = default_weight;
            sum_weights_stretched += column->StretchWeight;
            if (table->LeftMostStretchedColumnDisplayOrder == -1 || table->LeftMostStretchedColumnDisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumnDisplayOrder = (ImS8)column->DisplayOrder;
        }
        max_width_auto = ImMax(max_width_auto, width_auto);
        sum_width_fixed_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsVisibleFixedCount = (ImS8)count_fixed;

    // Apply "same widths"
    // - When all columns are fixed or columns are of mixed type: use the maximum auto width
    // - When all columns are stretch: use same weight
    const bool mixed_same_widths = (table->Flags & ImGuiTableFlags_SameWidths) && count_fixed > 0;
    if (table->Flags & ImGuiTableFlags_SameWidths)
    {
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            if (table->VisibleMaskByIndex & ((ImU64)1 << column_n))
            {
                ImGuiTableColumn* column = &table->Columns[column_n];
                if (column->Flags & (ImGuiTableColumnFlags_WidthFixed | ImGuiTableColumnFlags_WidthAutoResize))
                {
                    sum_width_fixed_requests += max_width_auto - column->WidthRequest; // Update old sum
                    column->WidthRequest = max_width_auto;
                }
                else
                {
                    sum_weights_stretched += 1.0f - column->StretchWeight; // Update old sum
                    column->StretchWeight = 1.0f;
                    if (count_fixed > 0)
                        column->WidthRequest = max_width_auto;
                }
            }
    }

    // Layout
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsVisibleCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = mixed_same_widths ? 0.0f : width_avail - width_spacings - sum_width_fixed_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;

    // Apply final width based on requested widths
    // Mark some columns as not resizable
    int count_resizable = 0;
    table->ColumnsTotalWidth = width_spacings;
    table->ColumnsAutoFitWidth = width_spacings;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];

        // Allocate width for stretched/weighted columns
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            // StretchWeight gets converted into WidthRequest
            if (!mixed_same_widths) 
            {
                float weight_ratio = column->StretchWeight / sum_weights_stretched;
                column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, min_column_width) + 0.01f);
                width_remaining_for_stretched_columns -= column->WidthRequest;
            }

            // [Resize Rule 2] Resizing from right-side of a stretch column preceding a fixed column
            // needs to forward resizing to left-side of fixed column. We also need to copy the NoResize flag..
            if (column->NextVisibleColumn != -1)
                if (ImGuiTableColumn* next_column = &table->Columns[column->NextVisibleColumn])
                    if (next_column->Flags & ImGuiTableColumnFlags_WidthFixed)
                        column->Flags |= (next_column->Flags & ImGuiTableColumnFlags_NoDirectResize_);
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // (see comments in TableResizeColumn())
        if (column->NextVisibleColumn == -1 && table->LeftMostStretchedColumnDisplayOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        if (!(column->Flags & ImGuiTableColumnFlags_NoResize))
            count_resizable++;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, min_column_width));
        table->ColumnsTotalWidth += column->WidthGiven + table->CellPaddingX * 2.0f;
        table->ColumnsAutoFitWidth += column->WidthAuto + table->CellPaddingX * 2.0f;
    }

    // Redistribute remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor), could be adjusted depending
    // on where the mouse cursor is and/or relative weights.
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; sum_weights_stretched > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    // Detect hovered column
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // Setup final position, offset and clipping rectangles
    int visible_n = 0;
    float offset_x = (table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x;
    offset_x += table->OuterPaddingX;
    offset_x -= table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (table->FreezeColumnsCount > 0 && table->FreezeColumnsCount == visible_n)
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;

        if ((table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsClipped = column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Maximum width
        float max_width = FLT_MAX;
        if (table->Flags & ImGuiTableFlags_ScrollX)
        {
            // Frozen columns can't reach beyond visible width else scrolling will naturally break.
            if (order_n < table->FreezeColumnsRequest)
            {
                max_width = (table->InnerClipRect.Max.x - (table->FreezeColumnsRequest - order_n) * min_column_distance) - offset_x;
                max_width = max_width - table->OuterPaddingX - table->CellPaddingX - table->CellSpacingX2;
            }
        }
        else if ((table->Flags & ImGuiTableFlags_NoKeepColumnsVisible) == 0)
        {
            // If horizontal scrolling if disabled, we apply a final lossless shrinking of columns in order to make
            // sure they are all visible. Because of this we also know that all of the columns will always fit in
            // table->WorkRect and therefore in table->InnerRect (because ScrollX is off)
            // FIXME-TABLE: This is solved incorrectly but also quite a difficult problem to fix as we also want ClipRect width to match.
            // See "table_width_distrib" and "table_width_keep_visible" tests
            max_width = table->WorkRect.Max.x - (table->ColumnsVisibleCount - column->IndexWithinVisibleSet - 1) * min_column_distance - offset_x;
            //max_width -= table->CellSpacingX1;
            max_width -= table->CellSpacingX2;
            max_width -= table->CellPaddingX * 2.0f;
            max_width -= table->OuterPaddingX;
        }
        column->WidthGiven = ImMin(column->WidthGiven, max_width);

        // Minimum width
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, min_column_width));

        // Lock all our positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) is detrimental to visibility in very-small column.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->MinX = offset_x;
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; // column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        column->IsClipped = (column->ClipRect.Max.x <= column->ClipRect.Min.x) && (column->AutoFitQueue & 1) == 0 && (column->CannotSkipItemsQueue & 1) == 0;
        if (column->IsClipped)
            table->VisibleUnclippedMaskByIndex &= ~((ImU64)1 << column_n); // Columns with the _WidthAutoResize sizing policy will never be updated then.

        column->IsSkipItems = !column->IsVisible || table->HostSkipItems;

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImS8)column_n;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImMax(host_clip_rect.Min.x, column->MaxX + TABLE_BORDER_SIZE);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        float unused_x1 = table->WorkRect.Min.x;
        if (table->RightMostVisibleColumn != -1)
            unused_x1 = ImMax(unused_x1, table->Columns[table->RightMostVisibleColumn].ClipRect.Max.x);
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImS8)table->ColumnsCount;
    }

    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag,
    // either because of using _WidthAutoResize/_WidthStretch).
    // This will hide the resizing option from the context menu.
    if (count_resizable == 0 && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // Allocate draw channels
    TableUpdateDrawChannels(table);

    // Borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);

    // Reset fields after we used them in TableSetupResize()
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_UNCLIPPED);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);

    // Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);
}